

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O2

wchar_t archive_string_normalize_D(archive_string *as,void *_p,size_t len,archive_string_conv *sc)

{
  char cVar1;
  uint uVar2;
  uint32_t uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  archive_string *paVar7;
  long lVar8;
  wchar_t wVar9;
  undefined7 uVar10;
  ulong uVar11;
  ulong uVar12;
  char *pcVar13;
  ulong uVar14;
  uint uVar15;
  undefined8 unaff_R13;
  undefined7 uVar17;
  char *pcVar16;
  ulong uVar18;
  char *pcVar19;
  long lVar20;
  char *pcVar21;
  long lStack_100;
  uint32_t uc;
  long local_f0;
  size_t local_e8;
  code *local_e0;
  undefined4 local_d4;
  char *local_d0;
  long local_c8;
  long local_c0;
  wchar_t local_b4;
  ulong local_b0;
  uint local_a8;
  uint32_t uc2;
  code *local_a0;
  ulong local_98;
  ulong local_90;
  anon_struct_8_2_74731b7c fdc [10];
  
  wVar9 = sc->flag;
  lStack_100 = 2;
  uVar10 = (undefined7)((ulong)sc >> 8);
  uVar17 = (undefined7)((ulong)unaff_R13 >> 8);
  if (((uint)wVar9 >> 10 & 1) == 0) {
    if (((uint)wVar9 >> 0xc & 1) == 0) {
      if (((uint)wVar9 >> 8 & 1) == 0) {
        if (((uint)wVar9 >> 0xb & 1) == 0) {
          uVar15 = (uint)wVar9 >> 0xd & 1;
          uVar18 = (ulong)uVar15;
          lStack_100 = uVar18 + 1;
          local_e0 = unicode_to_utf8;
          if (uVar15 != 0) {
            local_e0 = unicode_to_utf16le;
          }
        }
        else {
          local_e0 = unicode_to_utf16be;
          uVar18 = CONCAT71(uVar17,1);
        }
        local_d4 = 0;
      }
      else {
        local_d4 = (undefined4)CONCAT71(uVar10,((uint)wVar9 >> 9 & 1) == 0);
        local_e0 = unicode_to_utf8;
        lStack_100 = 1;
        uVar18 = 0;
      }
      goto LAB_0015df49;
    }
    local_d4 = (undefined4)CONCAT71(uVar10,((uint)wVar9 >> 0xd & 1) == 0);
    local_e0 = unicode_to_utf16le;
  }
  else {
    local_d4 = (undefined4)CONCAT71(uVar10,((uint)wVar9 >> 0xb & 1) == 0);
    local_e0 = unicode_to_utf16be;
  }
  uVar18 = CONCAT71(uVar17,1);
LAB_0015df49:
  lVar20 = 1;
  local_a8 = 4;
  if (((uint)wVar9 >> 0xb & 1) == 0) {
    if (((uint)wVar9 >> 0xd & 1) == 0) {
      local_a0 = cesu8_to_unicode;
      local_a8 = 6;
      lVar20 = lStack_100;
    }
    else {
      local_a0 = utf16le_to_unicode;
    }
  }
  else {
    local_a0 = utf16be_to_unicode;
  }
  paVar7 = archive_string_ensure(as,lVar20 * len + lStack_100 + as->length);
  if (paVar7 == (archive_string *)0x0) {
LAB_0015e781:
    local_b4 = L'\xffffffff';
  }
  else {
    pcVar16 = as->s + as->length;
    local_c8 = -lStack_100;
    pcVar13 = as->s + (as->buffer_length - lStack_100);
    local_b4 = L'\0';
    local_c0 = lVar20;
    local_98 = uVar18;
switchD_0015e6a9_default:
    pcVar21 = (char *)_p;
    uVar15 = (*local_a0)(&uc,pcVar21,len);
    local_f0 = lStack_100;
    if (uVar15 != 0) {
      while (uVar18 = (ulong)uVar15, -1 < (int)uVar15) {
        pcVar19 = pcVar21;
        if (uVar15 == local_a8) {
          pcVar19 = (char *)0x0;
        }
        if ((char)local_d4 != '\0') {
          pcVar19 = (char *)0x0;
        }
        local_d0 = pcVar21 + uVar18;
        len = len - uVar18;
        uVar15 = uc - 0xac00;
        if (uVar15 < 0x2ba4) {
          uc = (uVar15 & 0xffff) / 0x24c | 0x1100;
          uVar2 = (uVar15 & 0xffff) % 0x1c;
          local_b0 = (ulong)(ushort)uVar2;
          lVar20 = len * local_c0 + local_f0;
          local_e8 = len;
          goto LAB_0015e50d;
        }
        local_b0 = uVar18;
        if ((((uc < 0x1d300) && (uc < 0x1d245)) && (""[uc >> 8] != '\0')) &&
           (ccc_val[ccc_val_index[""[uc >> 8]][uc >> 4 & 0xf]][uc & 0xf] != '\0')) {
          if (pcVar19 == (char *)0x0) {
            lVar20 = len * local_c0 + local_f0;
            goto LAB_0015e6c6;
          }
          if (pcVar13 < pcVar16 + uVar18) {
            as->length = (long)pcVar16 - (long)as->s;
            paVar7 = archive_string_ensure(as,len * local_c0 + local_f0 + as->buffer_length);
            if (paVar7 == (archive_string *)0x0) goto LAB_0015e781;
            pcVar16 = as->s + as->length;
            pcVar13 = as->s + local_c8 + as->buffer_length;
          }
          _p = local_d0;
          lStack_100 = local_f0;
          switch((int)local_b0) {
          case 1:
            break;
          case 4:
            pcVar21 = pcVar19 + 1;
            *pcVar16 = *pcVar19;
            pcVar16 = pcVar16 + 1;
          case 3:
            cVar1 = *pcVar21;
            pcVar21 = pcVar21 + 1;
            *pcVar16 = cVar1;
            pcVar16 = pcVar16 + 1;
          case 2:
            cVar1 = *pcVar21;
            pcVar21 = pcVar21 + 1;
            *pcVar16 = cVar1;
            pcVar16 = pcVar16 + 1;
            break;
          default:
            goto switchD_0015e6a9_default;
          }
          *pcVar16 = *pcVar21;
          pcVar16 = pcVar16 + 1;
          _p = local_d0;
          goto switchD_0015e6a9_default;
        }
        local_90 = uVar18;
        uVar18 = 0;
        while (((0x2ff < uc - 0x2f800 && ((uc & 0xfffff000) != 0x2000)) &&
               ((0x1ff < uc - 0xf900 &&
                ((0x11 < uc - 0x1109a || ((0x20005U >> (uc - 0x1109a & 0x1f) & 1) == 0))))))) {
          iVar5 = 0x3a2;
          iVar6 = 0;
          while( true ) {
            while( true ) {
              if (iVar5 < iVar6) goto LAB_0015e21b;
              iVar4 = (iVar5 + iVar6) / 2;
              if (uc <= u_decomposition_table[iVar4].nfc) break;
              iVar6 = iVar4 + 1;
            }
            if (u_decomposition_table[iVar4].nfc <= uc) break;
            iVar5 = iVar4 + -1;
          }
          if (9 < (uint)uVar18) break;
          uc = u_decomposition_table[iVar4].cp1;
          fdc[0].uc = u_decomposition_table[iVar4].cp2;
          for (uVar11 = uVar18; 0 < (long)uVar11; uVar11 = uVar11 - 1) {
            fdc[uVar11] = fdc[uVar11 - 1];
          }
          fdc[0].ccc = L'\0';
          if (fdc[0].uc < 0x1d245) {
            fdc[0].ccc = (wchar_t)ccc_val[ccc_val_index[""[fdc[0].uc >> 8]][fdc[0].uc >> 4 & 0xf]]
                                  [fdc[0].uc & 0xf];
          }
          uVar18 = uVar18 + 1;
          pcVar19 = (char *)0x0;
        }
LAB_0015e21b:
        local_e8 = len;
        uVar15 = (*local_a0)(&uc2,local_d0,len);
        if ((((0 < (int)uVar15) && (uc2 < 0x1d245)) &&
            (wVar9 = (wchar_t)ccc_val[ccc_val_index[""[uc2 >> 8]][uc2 >> 4 & 0xf]][uc2 & 0xf],
            wVar9 != L'\0')) && (uVar18 < 10)) {
          local_d0 = local_d0 + uVar15;
          len = local_e8 - uVar15;
          for (uVar11 = 0; uVar12 = uVar18, uVar18 != uVar11; uVar11 = uVar11 + 1) {
            uVar14 = uVar18;
            if (wVar9 < fdc[uVar11].ccc) goto LAB_0015e207;
          }
          goto LAB_0015e1f7;
        }
        if (pcVar19 == (char *)0x0) {
          lVar20 = local_e8 * local_c0 + local_f0;
          while (lVar8 = (*local_e0)(pcVar16,(long)pcVar13 - (long)pcVar16,uc), lVar8 == 0) {
            as->length = (long)pcVar16 - (long)as->s;
            paVar7 = archive_string_ensure(as,as->buffer_length + lVar20);
            if (paVar7 == (archive_string *)0x0) goto LAB_0015e781;
            pcVar16 = as->s + as->length;
            pcVar13 = as->s + local_c8 + as->buffer_length;
          }
          pcVar16 = pcVar16 + lVar8;
        }
        else {
          if (pcVar13 < pcVar16 + local_90) {
            as->length = (long)pcVar16 - (long)as->s;
            paVar7 = archive_string_ensure(as,local_e8 * local_c0 + local_f0 + as->buffer_length);
            if (paVar7 == (archive_string *)0x0) goto LAB_0015e781;
            pcVar16 = as->s + as->length;
            pcVar13 = as->s + local_c8 + as->buffer_length;
          }
          switch((int)local_b0) {
          case 4:
            cVar1 = *pcVar19;
            pcVar19 = pcVar19 + 1;
            *pcVar16 = cVar1;
            pcVar16 = pcVar16 + 1;
          case 3:
            cVar1 = *pcVar19;
            pcVar19 = pcVar19 + 1;
            *pcVar16 = cVar1;
            pcVar16 = pcVar16 + 1;
          case 2:
            cVar1 = *pcVar19;
            pcVar19 = pcVar19 + 1;
            *pcVar16 = cVar1;
            pcVar16 = pcVar16 + 1;
          case 1:
            *pcVar16 = *pcVar19;
            pcVar16 = pcVar16 + 1;
          }
        }
        lVar20 = local_e8 * local_c0 + local_f0;
        local_b0 = uVar18 & 0xffffffff;
        for (uVar18 = 0; uVar18 != local_b0; uVar18 = uVar18 + 1) {
          uc = fdc[uVar18].uc;
          while (lVar8 = (*local_e0)(pcVar16,(long)pcVar13 - (long)pcVar16,uc), lVar8 == 0) {
            as->length = (long)pcVar16 - (long)as->s;
            paVar7 = archive_string_ensure(as,as->buffer_length + lVar20);
            if (paVar7 == (archive_string *)0x0) goto LAB_0015e781;
            pcVar16 = as->s + as->length;
            pcVar13 = as->s + local_c8 + as->buffer_length;
          }
          pcVar16 = pcVar16 + lVar8;
        }
        if (uVar15 == 0) goto LAB_0015e7d5;
        uc = uc2;
        len = local_e8;
        pcVar21 = local_d0;
      }
      lVar20 = len * local_c0 + local_f0;
      local_e8 = len;
      while (lVar8 = (*local_e0)(pcVar16,(long)pcVar13 - (long)pcVar16,uc), lVar8 == 0) {
        as->length = (long)pcVar16 - (long)as->s;
        paVar7 = archive_string_ensure(as,as->buffer_length + lVar20);
        if (paVar7 == (archive_string *)0x0) goto LAB_0015e781;
        pcVar16 = as->s + as->length;
        pcVar13 = as->s + local_c8 + as->buffer_length;
      }
      pcVar16 = pcVar16 + lVar8;
      len = local_e8 - -uVar15;
      local_b4 = L'\xffffffff';
      _p = pcVar21 + -uVar15;
      lStack_100 = local_f0;
      goto switchD_0015e6a9_default;
    }
LAB_0015e7d5:
    as->length = (long)pcVar16 - (long)as->s;
    *pcVar16 = '\0';
    if ((char)local_98 != '\0') {
      as->s[as->length + 1] = '\0';
    }
  }
  return local_b4;
LAB_0015e50d:
  lVar8 = (*local_e0)(pcVar16,(long)pcVar13 - (long)pcVar16,uc);
  if (lVar8 != 0) goto LAB_0015e576;
  as->length = (long)pcVar16 - (long)as->s;
  paVar7 = archive_string_ensure(as,as->buffer_length + lVar20);
  if (paVar7 == (archive_string *)0x0) goto LAB_0015e781;
  pcVar16 = as->s + as->length;
  pcVar13 = as->s + local_c8 + as->buffer_length;
  goto LAB_0015e50d;
LAB_0015e576:
  pcVar16 = pcVar16 + lVar8;
  uc = ((uVar15 & 0xffff) % 0x24c) / 0x1c + 0x1161;
  while (lVar8 = (*local_e0)(pcVar16,(long)pcVar13 - (long)pcVar16,uc), lVar8 == 0) {
    as->length = (long)pcVar16 - (long)as->s;
    paVar7 = archive_string_ensure(as,as->buffer_length + lVar20);
    if (paVar7 == (archive_string *)0x0) goto LAB_0015e781;
    pcVar16 = as->s + as->length;
    pcVar13 = as->s + local_c8 + as->buffer_length;
  }
  pcVar16 = pcVar16 + lVar8;
  len = local_e8;
  _p = local_d0;
  lStack_100 = local_f0;
  uVar3 = uVar2 + 0x11a7;
  if ((short)local_b0 != 0) {
    while (uc = uVar3, _p = local_d0, lVar8 = (*local_e0)(pcVar16,(long)pcVar13 - (long)pcVar16,uc),
          lVar8 == 0) {
      as->length = (long)pcVar16 - (long)as->s;
      paVar7 = archive_string_ensure(as,as->buffer_length + lVar20);
      if (paVar7 == (archive_string *)0x0) goto LAB_0015e781;
      pcVar16 = as->s + as->length;
      pcVar13 = as->s + local_c8 + as->buffer_length;
      uVar3 = uc;
    }
    pcVar16 = pcVar16 + lVar8;
    len = local_e8;
    lStack_100 = local_f0;
  }
  goto switchD_0015e6a9_default;
LAB_0015e207:
  for (; uVar12 = uVar11, (long)uVar11 < (long)uVar14; uVar14 = uVar14 - 1) {
    fdc[uVar14] = fdc[uVar14 - 1];
  }
LAB_0015e1f7:
  fdc[uVar12].ccc = wVar9;
  fdc[uVar12].uc = uc2;
  uVar18 = uVar18 + 1;
  goto LAB_0015e21b;
LAB_0015e6c6:
  lVar8 = (*local_e0)(pcVar16,(long)pcVar13 - (long)pcVar16,uc);
  if (lVar8 != 0) goto LAB_0015e729;
  as->length = (long)pcVar16 - (long)as->s;
  paVar7 = archive_string_ensure(as,as->buffer_length + lVar20);
  if (paVar7 == (archive_string *)0x0) goto LAB_0015e781;
  pcVar16 = as->s + as->length;
  pcVar13 = as->s + local_c8 + as->buffer_length;
  goto LAB_0015e6c6;
LAB_0015e729:
  pcVar16 = pcVar16 + lVar8;
  _p = local_d0;
  lStack_100 = local_f0;
  goto switchD_0015e6a9_default;
}

Assistant:

static int
archive_string_normalize_D(struct archive_string *as, const void *_p,
    size_t len, struct archive_string_conv *sc)
{
	const char *s = (const char *)_p;
	char *p, *endp;
	uint32_t uc, uc2;
	size_t w;
	int always_replace, n, n2, ret = 0, spair, ts, tm;
	int (*parse)(uint32_t *, const char *, size_t);
	size_t (*unparse)(char *, size_t, uint32_t);

	always_replace = 1;
	ts = 1;/* text size. */
	if (sc->flag & SCONV_TO_UTF16BE) {
		unparse = unicode_to_utf16be;
		ts = 2;
		if (sc->flag & SCONV_FROM_UTF16BE)
			always_replace = 0;
	} else if (sc->flag & SCONV_TO_UTF16LE) {
		unparse = unicode_to_utf16le;
		ts = 2;
		if (sc->flag & SCONV_FROM_UTF16LE)
			always_replace = 0;
	} else if (sc->flag & SCONV_TO_UTF8) {
		unparse = unicode_to_utf8;
		if (sc->flag & SCONV_FROM_UTF8)
			always_replace = 0;
	} else {
		/*
		 * This case is going to be converted to another
		 * character-set through iconv.
		 */
		always_replace = 0;
		if (sc->flag & SCONV_FROM_UTF16BE) {
			unparse = unicode_to_utf16be;
			ts = 2;
		} else if (sc->flag & SCONV_FROM_UTF16LE) {
			unparse = unicode_to_utf16le;
			ts = 2;
		} else {
			unparse = unicode_to_utf8;
		}
	}

	if (sc->flag & SCONV_FROM_UTF16BE) {
		parse = utf16be_to_unicode;
		tm = 1;
		spair = 4;/* surrogate pair size in UTF-16. */
	} else if (sc->flag & SCONV_FROM_UTF16LE) {
		parse = utf16le_to_unicode;
		tm = 1;
		spair = 4;/* surrogate pair size in UTF-16. */
	} else {
		parse = cesu8_to_unicode;
		tm = ts;
		spair = 6;/* surrogate pair size in UTF-8. */
	}

	if (archive_string_ensure(as, as->length + len * tm + ts) == NULL)
		return (-1);

	p = as->s + as->length;
	endp = as->s + as->buffer_length - ts;
	while ((n = parse(&uc, s, len)) != 0) {
		const char *ucptr;
		uint32_t cp1, cp2;
		int SIndex;
		struct {
			uint32_t uc;
			int ccc;
		} fdc[FDC_MAX];
		int fdi, fdj;
		int ccc;

check_first_code:
		if (n < 0) {
			/* Use a replaced unicode character. */
			UNPARSE(p, endp, uc);
			s += n*-1;
			len -= n*-1;
			ret = -1;
			continue;
		} else if (n == spair || always_replace)
			/* uc is converted from a surrogate pair.
			 * this should be treated as a changed code. */
			ucptr = NULL;
		else
			ucptr = s;
		s += n;
		len -= n;

		/* Hangul Decomposition. */
		if ((SIndex = uc - HC_SBASE) >= 0 && SIndex < HC_SCOUNT) {
			int L = HC_LBASE + SIndex / HC_NCOUNT;
			int V = HC_VBASE + (SIndex % HC_NCOUNT) / HC_TCOUNT;
			int T = HC_TBASE + SIndex % HC_TCOUNT;

			REPLACE_UC_WITH(L);
			WRITE_UC();
			REPLACE_UC_WITH(V);
			WRITE_UC();
			if (T != HC_TBASE) {
				REPLACE_UC_WITH(T);
				WRITE_UC();
			}
			continue;
		}
		if (IS_DECOMPOSABLE_BLOCK(uc) && CCC(uc) != 0) {
			WRITE_UC();
			continue;
		}

		fdi = 0;
		while (get_nfd(&cp1, &cp2, uc) && fdi < FDC_MAX) {
			int k;

			for (k = fdi; k > 0; k--)
				fdc[k] = fdc[k-1];
			fdc[0].ccc = CCC(cp2);
			fdc[0].uc = cp2;
			fdi++;
			REPLACE_UC_WITH(cp1);
		}

		/* Read following code points. */
		while ((n2 = parse(&uc2, s, len)) > 0 &&
		    (ccc = CCC(uc2)) != 0 && fdi < FDC_MAX) {
			int j, k;

			s += n2;
			len -= n2;
			for (j = 0; j < fdi; j++) {
				if (fdc[j].ccc > ccc)
					break;
			}
			if (j < fdi) {
				for (k = fdi; k > j; k--)
					fdc[k] = fdc[k-1];
				fdc[j].ccc = ccc;
				fdc[j].uc = uc2;
			} else {
				fdc[fdi].ccc = ccc;
				fdc[fdi].uc = uc2;
			}
			fdi++;
		}

		WRITE_UC();
		for (fdj = 0; fdj < fdi; fdj++) {
			REPLACE_UC_WITH(fdc[fdj].uc);
			WRITE_UC();
		}

		if (n2 == 0)
			break;
		REPLACE_UC_WITH(uc2);
		n = n2;
		goto check_first_code;
	}
	as->length = p - as->s;
	as->s[as->length] = '\0';
	if (ts == 2)
		as->s[as->length+1] = '\0';
	return (ret);
}